

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  long *plVar1;
  undefined8 *puVar2;
  string *psVar3;
  long *plVar4;
  ulong *puVar5;
  ulong uVar6;
  long lVar7;
  long *local_270;
  long local_260;
  undefined8 uStack_258;
  ulong *local_250;
  long local_248;
  ulong local_240;
  long lStack_238;
  string *local_230;
  ulong *local_228;
  long local_220;
  ulong local_218 [2];
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8;
  undefined7 uStack_1b7;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  psVar3 = (string *)&__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)psVar3;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (0 < *(int *)((long)this + 0xc)) {
    lVar7 = 0;
    local_230 = __return_storage_ptr__;
    do {
      local_1c8 = &local_1b8;
      local_1c0 = 0;
      local_1b8 = 0;
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_1c8);
      local_208 = &local_1f8;
      plVar4 = plVar1 + 2;
      if ((long *)*plVar1 == plVar4) {
        local_1f8 = *plVar4;
        lStack_1f0 = plVar1[3];
      }
      else {
        local_1f8 = *plVar4;
        local_208 = (long *)*plVar1;
      }
      local_200 = plVar1[1];
      *plVar1 = (long)plVar4;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_208);
      local_1e8 = &local_1d8;
      plVar4 = plVar1 + 2;
      if ((long *)*plVar1 == plVar4) {
        local_1d8 = *plVar4;
        lStack_1d0 = plVar1[3];
      }
      else {
        local_1d8 = *plVar4;
        local_1e8 = (long *)*plVar1;
      }
      local_1e0 = plVar1[1];
      *plVar1 = (long)plVar4;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_1e8);
      puVar5 = (ulong *)(plVar1 + 2);
      if ((ulong *)*plVar1 == puVar5) {
        local_240 = *puVar5;
        lStack_238 = plVar1[3];
        local_250 = &local_240;
      }
      else {
        local_240 = *puVar5;
        local_250 = (ulong *)*plVar1;
      }
      local_248 = plVar1[1];
      *plVar1 = (long)puVar5;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::_M_insert<double>((double)*(float *)((long)this + lVar7 * 4 + 4));
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar6 = 0xf;
      if (local_250 != &local_240) {
        uVar6 = local_240;
      }
      if (uVar6 < (ulong)(local_220 + local_248)) {
        uVar6 = 0xf;
        if (local_228 != local_218) {
          uVar6 = local_218[0];
        }
        if (uVar6 < (ulong)(local_220 + local_248)) goto LAB_0141c48e;
        puVar2 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,(ulong)local_250);
      }
      else {
LAB_0141c48e:
        puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_228);
      }
      plVar1 = puVar2 + 2;
      if ((long *)*puVar2 == plVar1) {
        local_260 = *plVar1;
        uStack_258 = puVar2[3];
        local_270 = &local_260;
      }
      else {
        local_260 = *plVar1;
        local_270 = (long *)*puVar2;
      }
      *puVar2 = plVar1;
      puVar2[1] = 0;
      *(undefined1 *)plVar1 = 0;
      std::__cxx11::string::_M_append((char *)local_230,(ulong)local_270);
      if (local_270 != &local_260) {
        operator_delete(local_270,local_260 + 1);
      }
      if (local_228 != local_218) {
        operator_delete(local_228,local_218[0] + 1);
      }
      if (local_250 != &local_240) {
        operator_delete(local_250,local_240 + 1);
      }
      if (local_1e8 != &local_1d8) {
        operator_delete(local_1e8,local_1d8 + 1);
      }
      if (local_208 != &local_1f8) {
        operator_delete(local_208,local_1f8 + 1);
      }
      if (local_1c8 != &local_1b8) {
        operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
      }
      lVar7 = lVar7 + 1;
      psVar3 = (string *)(long)*(int *)((long)this + 0xc);
    } while (lVar7 < (long)psVar3);
  }
  return psVar3;
}

Assistant:

tcu::Surface getPixels (const glu::RenderContext& rCtx, const RandomViewport& vp)
{
	return getPixels(rCtx, vp.x, vp.y, vp.width, vp.height);
}